

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_9.c
# Opt level: O3

int * aom_fast9_score(byte *i,int stride,xy *corners,int num_corners,int b)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  
  piVar6 = (int *)malloc((long)num_corners * 4);
  if (0 < num_corners && piVar6 != (int *)0x0) {
    lVar10 = (long)stride;
    lVar2 = lVar10 * 3;
    lVar12 = lVar10 * -2;
    lVar13 = lVar10 * -3;
    lVar7 = (long)(-3 - stride);
    lVar8 = (long)(3 - stride);
    uVar15 = 0;
    do {
      lVar9 = corners[uVar15].y * lVar10;
      lVar3 = corners[uVar15].x + lVar9;
      iVar14 = b + 0xff;
      iVar17 = 0xff;
      iVar11 = b;
      do {
        iVar14 = iVar14 / 2;
        uVar5 = iVar14 + (uint)i[corners[uVar15].x + lVar9];
        uVar16 = (uint)i[corners[uVar15].x + lVar9] - iVar14;
        iVar18 = iVar14;
        if ((int)uVar5 < (int)(uint)i[lVar2 + lVar3]) {
          if ((int)uVar5 < (int)(uint)i[lVar2 + lVar3 + 1]) {
            if ((int)uVar5 < (int)(uint)i[lVar10 * 2 + lVar3 + 2]) {
              if ((int)uVar5 < (int)(uint)i[lVar10 + lVar3 + 3]) {
                if ((int)uVar5 < (int)(uint)i[lVar3 + 3]) {
                  if ((int)uVar5 < (int)(uint)i[lVar8 + lVar3]) {
                    if ((int)uVar5 < (int)(uint)i[lVar12 + lVar3 + 2]) {
                      if ((int)uVar5 < (int)(uint)i[lVar13 + lVar3 + 1]) {
                        if ((int)uVar5 < (int)(uint)i[lVar13 + lVar3]) goto LAB_003d36cc;
                      }
                      else {
                        bVar1 = i[lVar10 * 2 + lVar3 + -2];
                        uVar4 = (uint)bVar1;
                        if ((int)uVar16 <= (int)(uint)i[lVar13 + lVar3 + 1])
                        goto joined_r0x003d3cc2;
                        if (bVar1 <= uVar5) {
                          if ((((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar13 + lVar3] < uVar16)
                               ) && (i[lVar13 + lVar3 + -1] < uVar16)) &&
                             (((i[lVar12 + lVar3 + -2] < uVar16 && (i[lVar7 + lVar3] < uVar16)) &&
                              (i[lVar3 + -3] < uVar16)))) {
                            uVar4 = (uint)i[lVar10 + lVar3 + -3];
                            goto joined_r0x003d2368;
                          }
                          goto LAB_003d3d85;
                        }
                      }
LAB_003d2981:
                      uVar16 = (uint)i[lVar2 + lVar3 + -1];
LAB_003d365e:
                      if (uVar5 < uVar16) goto LAB_003d36cc;
                    }
                    else if ((int)(uint)i[lVar12 + lVar3 + 2] < (int)uVar16) {
                      if (uVar5 < i[lVar2 + lVar3 + -1]) {
                        bVar1 = i[lVar10 + lVar3 + -3];
                        if (uVar5 < bVar1) goto LAB_003d310f;
                        if (((bVar1 <= uVar16 && uVar16 != bVar1) &&
                            (i[lVar13 + lVar3 + 1] < uVar16)) &&
                           (((i[lVar13 + lVar3] < uVar16 &&
                             ((i[lVar13 + lVar3 + -1] < uVar16 && (i[lVar12 + lVar3 + -2] < uVar16))
                             )) && (i[lVar7 + lVar3] < uVar16)))) {
                          uVar4 = (uint)i[lVar3 + -3];
                          goto joined_r0x003d279b;
                        }
                      }
                      else if ((((i[lVar13 + lVar3 + 1] < uVar16) && (i[lVar13 + lVar3] < uVar16))
                               && (i[lVar13 + lVar3 + -1] < uVar16)) &&
                              (i[lVar12 + lVar3 + -2] < uVar16)) {
                        bVar1 = i[lVar7 + lVar3];
                        goto joined_r0x003d33c7;
                      }
                    }
                    else {
                      if (uVar5 < i[lVar10 + lVar3 + -3]) {
LAB_003d2972:
                        uVar4 = (uint)i[lVar10 * 2 + lVar3 + -2];
                        goto joined_r0x003d3cc2;
                      }
                      if (((((int)(uint)i[lVar10 + lVar3 + -3] < (int)uVar16) &&
                           (i[lVar13 + lVar3 + 1] < uVar16)) &&
                          ((i[lVar13 + lVar3] < uVar16 &&
                           ((i[lVar13 + lVar3 + -1] < uVar16 && (i[lVar12 + lVar3 + -2] < uVar16))))
                          )) && (i[lVar7 + lVar3] < uVar16)) {
                        bVar1 = i[lVar3 + -3];
                        goto joined_r0x003d316c;
                      }
                    }
                  }
                  else if ((int)(uint)i[lVar8 + lVar3] < (int)uVar16) {
                    bVar1 = i[lVar10 * 2 + lVar3 + -2];
                    if (uVar5 < bVar1) {
                      bVar1 = i[lVar3 + -3];
                      if (uVar5 < bVar1) {
                        if (uVar5 < i[lVar10 + lVar3 + -3]) {
                          if (i[lVar2 + lVar3 + -1] <= uVar5) {
                            bVar1 = i[lVar12 + lVar3 + 2];
                            goto joined_r0x003d24a3;
                          }
                          goto LAB_003d36cc;
                        }
                      }
                      else if (((bVar1 <= uVar16 && uVar16 != bVar1) &&
                               (i[lVar12 + lVar3 + 2] < uVar16)) &&
                              (((i[lVar13 + lVar3 + 1] < uVar16 &&
                                ((i[lVar13 + lVar3] < uVar16 && (i[lVar13 + lVar3 + -1] < uVar16))))
                               && (i[lVar12 + lVar3 + -2] < uVar16)))) {
                        bVar1 = i[lVar7 + lVar3];
                        goto joined_r0x003d2ba3;
                      }
                    }
                    else if (uVar16 < bVar1 || uVar16 == bVar1) {
                      if ((((i[lVar12 + lVar3 + 2] < uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) &&
                          (i[lVar13 + lVar3] < uVar16)) &&
                         ((i[lVar13 + lVar3 + -1] < uVar16 && (i[lVar12 + lVar3 + -2] < uVar16))))
                      goto LAB_003d2f2e;
                    }
                    else if (((i[lVar13 + lVar3 + 1] < uVar16) && (i[lVar13 + lVar3] < uVar16)) &&
                            ((i[lVar13 + lVar3 + -1] < uVar16 &&
                             (((i[lVar12 + lVar3 + -2] < uVar16 && (i[lVar7 + lVar3] < uVar16)) &&
                              (i[lVar3 + -3] < uVar16)))))) {
                      bVar1 = i[lVar10 + lVar3 + -3];
                      goto LAB_003d2b06;
                    }
                  }
                  else if (uVar5 < i[lVar3 + -3]) {
                    if ((uVar5 < i[lVar10 + lVar3 + -3]) && (uVar5 < i[lVar10 * 2 + lVar3 + -2])) {
                      if (uVar5 < i[lVar2 + lVar3 + -1]) goto LAB_003d36cc;
                      bVar1 = i[lVar12 + lVar3 + 2];
joined_r0x003d24a3:
                      if ((((uVar5 < bVar1) && (uVar5 < i[lVar13 + lVar3 + 1])) &&
                          (uVar5 < i[lVar13 + lVar3])) && (uVar5 < i[lVar13 + lVar3 + -1])) {
                        bVar1 = i[lVar12 + lVar3 + -2];
                        goto joined_r0x003d15df;
                      }
                    }
                  }
                  else if (((((((int)(uint)i[lVar3 + -3] < (int)uVar16) &&
                              (i[lVar13 + lVar3 + 1] < uVar16)) && (i[lVar13 + lVar3] < uVar16)) &&
                            ((i[lVar13 + lVar3 + -1] < uVar16 && (i[lVar12 + lVar3 + -2] < uVar16)))
                            ) && (i[lVar7 + lVar3] < uVar16)) && (i[lVar10 + lVar3 + -3] < uVar16))
                  {
                    bVar1 = i[lVar10 * 2 + lVar3 + -2];
LAB_003d2b06:
                    if (bVar1 < uVar16) {
                      bVar1 = i[lVar12 + lVar3 + 2];
LAB_003d3d6b:
                      if (bVar1 < uVar16) goto LAB_003d36cc;
                      goto LAB_003d36bd;
                    }
                  }
                }
                else if ((int)(uint)i[lVar3 + 3] < (int)uVar16) {
                  bVar1 = i[lVar10 + lVar3 + -3];
                  if (uVar5 < bVar1) {
                    bVar1 = i[lVar7 + lVar3];
                    if (uVar5 < bVar1) {
                      if (uVar5 < i[lVar3 + -3]) {
                        if (uVar5 < i[lVar10 * 2 + lVar3 + -2]) goto LAB_003d208e;
                        if (uVar5 < i[lVar8 + lVar3]) goto LAB_003d31f2;
                      }
                    }
                    else if (((((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar8 + lVar3] < uVar16))
                              && (i[lVar12 + lVar3 + 2] < uVar16)) &&
                             ((i[lVar13 + lVar3 + 1] < uVar16 && (i[lVar13 + lVar3] < uVar16)))) &&
                            (i[lVar13 + lVar3 + -1] < uVar16)) {
                      bVar1 = i[lVar12 + lVar3 + -2];
joined_r0x003d3097:
                      if (bVar1 < uVar16) goto LAB_003d3382;
                    }
                  }
                  else if (uVar16 < bVar1 || uVar16 == bVar1) {
                    if ((((i[lVar8 + lVar3] < uVar16) && (i[lVar12 + lVar3 + 2] < uVar16)) &&
                        (i[lVar13 + lVar3 + 1] < uVar16)) &&
                       (((i[lVar13 + lVar3] < uVar16 && (i[lVar13 + lVar3 + -1] < uVar16)) &&
                        (i[lVar12 + lVar3 + -2] < uVar16)))) {
LAB_003d29eb:
                      bVar1 = i[lVar7 + lVar3];
                      goto joined_r0x003d3097;
                    }
                  }
                  else if (((i[lVar13 + lVar3 + 1] < uVar16) && (i[lVar13 + lVar3] < uVar16)) &&
                          ((i[lVar13 + lVar3 + -1] < uVar16 &&
                           ((i[lVar12 + lVar3 + -2] < uVar16 && (i[lVar7 + lVar3] < uVar16)))))) {
                    bVar1 = i[lVar3 + -3];
                    goto LAB_003d2543;
                  }
                }
                else if (uVar5 < i[lVar7 + lVar3]) {
                  if ((uVar5 < i[lVar3 + -3]) && (uVar5 < i[lVar10 + lVar3 + -3])) {
                    if (uVar5 < i[lVar10 * 2 + lVar3 + -2]) {
LAB_003d208e:
                      if (uVar5 < i[lVar2 + lVar3 + -1]) goto LAB_003d36cc;
                    }
                    else if (i[lVar8 + lVar3] <= uVar5) goto LAB_003d3d85;
LAB_003d31f2:
                    if (((uVar5 < i[lVar12 + lVar3 + 2]) && (uVar5 < i[lVar13 + lVar3 + 1])) &&
                       ((uVar5 < i[lVar13 + lVar3] && (uVar5 < i[lVar13 + lVar3 + -1])))) {
LAB_003d16d2:
                      uVar16 = (uint)i[lVar12 + lVar3 + -2];
                      goto LAB_003d365e;
                    }
                  }
                }
                else if ((((((int)(uint)i[lVar7 + lVar3] < (int)uVar16) &&
                           (i[lVar13 + lVar3 + 1] < uVar16)) && (i[lVar13 + lVar3] < uVar16)) &&
                         ((i[lVar13 + lVar3 + -1] < uVar16 && (i[lVar12 + lVar3 + -2] < uVar16))))
                        && (i[lVar3 + -3] < uVar16)) {
                  bVar1 = i[lVar10 + lVar3 + -3];
LAB_003d2543:
                  if (bVar1 < uVar16) {
                    if (uVar16 <= i[lVar12 + lVar3 + 2]) goto LAB_003d36ae;
                    if (i[lVar8 + lVar3] < uVar16) goto LAB_003d36cc;
                    goto LAB_003d33ea;
                  }
                }
              }
              else {
                uVar4 = (uint)i[lVar12 + lVar3 + -2];
                if ((int)(uint)i[lVar10 + lVar3 + 3] < (int)uVar16) {
                  if (uVar5 < uVar4) {
                    if ((uVar5 < i[lVar7 + lVar3]) && (uVar5 < i[lVar3 + -3])) {
                      if (uVar5 < i[lVar10 + lVar3 + -3]) goto LAB_003d1d7a;
                      bVar1 = i[lVar3 + 3];
joined_r0x003d2cef:
                      if (uVar5 < bVar1) goto LAB_003d2cf5;
                    }
                  }
                  else if (((uVar4 < uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) &&
                          ((i[lVar13 + lVar3] < uVar16 &&
                           ((i[lVar13 + lVar3 + -1] < uVar16 && (i[lVar7 + lVar3] < uVar16)))))) {
                    if (i[lVar12 + lVar3 + 2] < uVar16) {
                      if (uVar16 <= i[lVar8 + lVar3]) goto LAB_003d33cd;
                      if (uVar16 <= i[lVar3 + 3]) goto LAB_003d2f42;
                      goto LAB_003d36cc;
                    }
                    if (i[lVar3 + -3] < uVar16) goto LAB_003d369f;
                  }
                }
                else if (uVar5 < uVar4) {
                  if ((uVar5 < i[lVar7 + lVar3]) && (uVar5 < i[lVar3 + -3])) {
                    if (i[lVar10 + lVar3 + -3] <= uVar5) {
                      bVar1 = i[lVar3 + 3];
                      goto joined_r0x003d2cef;
                    }
LAB_003d1d7a:
                    if (uVar5 < i[lVar10 * 2 + lVar3 + -2]) {
                      if (uVar5 < i[lVar2 + lVar3 + -1]) goto LAB_003d36cc;
LAB_003d2d09:
                      if (((uVar5 < i[lVar12 + lVar3 + 2]) && (uVar5 < i[lVar13 + lVar3 + 1])) &&
                         (uVar5 < i[lVar13 + lVar3])) {
                        uVar16 = (uint)i[lVar13 + lVar3 + -1];
                        goto LAB_003d365e;
                      }
                    }
                    else {
LAB_003d2cf5:
                      if (uVar5 < i[lVar8 + lVar3]) goto LAB_003d2d09;
                    }
                  }
                }
                else if ((((int)uVar4 < (int)uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) &&
                        ((i[lVar13 + lVar3] < uVar16 &&
                         (((i[lVar13 + lVar3 + -1] < uVar16 && (i[lVar7 + lVar3] < uVar16)) &&
                          (i[lVar3 + -3] < uVar16)))))) {
                  if (i[lVar12 + lVar3 + 2] < uVar16) {
                    if (uVar16 <= i[lVar8 + lVar3]) goto LAB_003d33db;
                    if (uVar16 <= i[lVar3 + 3]) goto LAB_003d30d3;
                    goto LAB_003d36cc;
                  }
LAB_003d369f:
                  bVar1 = i[lVar10 + lVar3 + -3];
joined_r0x003d316c:
                  if (bVar1 < uVar16) goto LAB_003d36ae;
                }
              }
            }
            else {
              uVar4 = (uint)i[lVar13 + lVar3 + -1];
              if ((int)(uint)i[lVar10 * 2 + lVar3 + 2] < (int)uVar16) {
                if (uVar5 < uVar4) {
                  if ((uVar5 < i[lVar12 + lVar3 + -2]) && (uVar5 < i[lVar7 + lVar3])) {
                    if (uVar5 < i[lVar3 + -3]) {
                      if (i[lVar10 + lVar3 + -3] <= uVar5) {
LAB_003d2703:
                        bVar1 = i[lVar3 + 3];
                        goto joined_r0x003d2816;
                      }
LAB_003d1a88:
                      if (i[lVar10 * 2 + lVar3 + -2] <= uVar5) goto LAB_003d2c2f;
                      if (uVar5 < i[lVar2 + lVar3 + -1]) goto LAB_003d36cc;
LAB_003d2c43:
                      if ((uVar5 < i[lVar12 + lVar3 + 2]) && (uVar5 < i[lVar13 + lVar3 + 1])) {
                        uVar16 = (uint)i[lVar13 + lVar3];
                        goto LAB_003d365e;
                      }
                    }
                    else if (uVar5 < i[lVar10 + lVar3 + 3]) goto LAB_003d2703;
                  }
                }
                else if ((((uVar4 < uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) &&
                         (i[lVar13 + lVar3] < uVar16)) && (i[lVar12 + lVar3 + -2] < uVar16)) {
                  if (i[lVar12 + lVar3 + 2] < uVar16) {
                    if (i[lVar8 + lVar3] < uVar16) {
                      if (i[lVar3 + 3] < uVar16) {
                        if (uVar16 <= i[lVar10 + lVar3 + 3]) goto LAB_003d29eb;
                        goto LAB_003d36cc;
                      }
LAB_003d2f2e:
                      if (i[lVar7 + lVar3] < uVar16) goto LAB_003d2f42;
                    }
                    else {
                      bVar1 = i[lVar7 + lVar3];
joined_r0x003d33c7:
                      if (bVar1 < uVar16) goto LAB_003d33cd;
                    }
                  }
                  else if (i[lVar7 + lVar3] < uVar16) goto LAB_003d3155;
                }
              }
              else if (uVar5 < uVar4) {
                if ((uVar5 < i[lVar12 + lVar3 + -2]) && (uVar5 < i[lVar7 + lVar3])) {
                  if (uVar5 < i[lVar3 + -3]) {
                    if (uVar5 < i[lVar10 + lVar3 + -3]) goto LAB_003d1a88;
                    bVar1 = i[lVar3 + 3];
                  }
                  else {
                    if (i[lVar10 + lVar3 + 3] <= uVar5) goto LAB_003d3d85;
                    bVar1 = i[lVar3 + 3];
                  }
joined_r0x003d2816:
                  if (uVar5 < bVar1) {
LAB_003d2c2f:
                    if (uVar5 < i[lVar8 + lVar3]) goto LAB_003d2c43;
                  }
                }
              }
              else if (((((int)uVar4 < (int)uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) &&
                       (i[lVar13 + lVar3] < uVar16)) &&
                      ((i[lVar12 + lVar3 + -2] < uVar16 && (i[lVar7 + lVar3] < uVar16)))) {
                if (i[lVar12 + lVar3 + 2] < uVar16) {
                  if (i[lVar8 + lVar3] < uVar16) {
                    if (uVar16 <= i[lVar3 + 3]) {
LAB_003d2f42:
                      bVar1 = i[lVar3 + -3];
                      goto joined_r0x003d2ba3;
                    }
                    if (i[lVar10 + lVar3 + 3] < uVar16) goto LAB_003d36cc;
LAB_003d3382:
                    uVar5 = (uint)i[lVar3 + -3];
                    goto LAB_003d36c3;
                  }
LAB_003d33cd:
                  bVar1 = i[lVar3 + -3];
joined_r0x003d3136:
                  if (bVar1 < uVar16) {
LAB_003d33db:
                    uVar4 = (uint)i[lVar10 + lVar3 + -3];
                    goto joined_r0x003d279b;
                  }
                }
                else {
LAB_003d3155:
                  if (i[lVar3 + -3] < uVar16) {
                    bVar1 = i[lVar10 + lVar3 + -3];
                    goto joined_r0x003d316c;
                  }
                }
              }
            }
          }
          else {
            uVar4 = (uint)i[lVar13 + lVar3];
            if ((int)(uint)i[lVar2 + lVar3 + 1] < (int)uVar16) {
              if (uVar5 < uVar4) {
                if ((uVar5 < i[lVar13 + lVar3 + -1]) && (uVar5 < i[lVar12 + lVar3 + -2])) {
                  if (uVar5 < i[lVar7 + lVar3]) {
                    if (i[lVar3 + -3] <= uVar5) {
LAB_003d22a3:
                      bVar1 = i[lVar10 + lVar3 + 3];
                      goto joined_r0x003d2314;
                    }
LAB_003d181c:
                    if (i[lVar10 + lVar3 + -3] <= uVar5) goto LAB_003d2725;
                    if (i[lVar10 * 2 + lVar3 + -2] <= uVar5) goto LAB_003d2733;
                    if (uVar5 < i[lVar2 + lVar3 + -1]) goto LAB_003d36cc;
LAB_003d2747:
                    if (uVar5 < i[lVar12 + lVar3 + 2]) {
                      uVar16 = (uint)i[lVar13 + lVar3 + 1];
                      goto LAB_003d365e;
                    }
                  }
                  else if (uVar5 < i[lVar10 * 2 + lVar3 + 2]) goto LAB_003d22a3;
                }
              }
              else if (((uVar4 < uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) &&
                      (i[lVar13 + lVar3 + -1] < uVar16)) {
                if (i[lVar12 + lVar3 + 2] < uVar16) {
                  if (i[lVar8 + lVar3] < uVar16) {
                    if (i[lVar3 + 3] < uVar16) {
                      if (i[lVar10 + lVar3 + 3] < uVar16) {
                        if (i[lVar10 * 2 + lVar3 + 2] < uVar16) goto LAB_003d36cc;
LAB_003d1a2b:
                        bVar1 = i[lVar12 + lVar3 + -2];
joined_r0x003d3349:
                        if (bVar1 < uVar16) goto LAB_003d334f;
                      }
                      else if (i[lVar12 + lVar3 + -2] < uVar16) goto LAB_003d336e;
                    }
                    else if (i[lVar12 + lVar3 + -2] < uVar16) goto LAB_003d30b1;
                  }
                  else if (i[lVar12 + lVar3 + -2] < uVar16) {
                    bVar1 = i[lVar7 + lVar3];
                    goto joined_r0x003d3128;
                  }
                }
                else if ((i[lVar12 + lVar3 + -2] < uVar16) && (i[lVar7 + lVar3] < uVar16)) {
                  bVar1 = i[lVar3 + -3];
joined_r0x003d2ccd:
                  if (bVar1 < uVar16) {
                    bVar1 = i[lVar10 + lVar3 + -3];
                    goto joined_r0x003d316c;
                  }
                }
              }
            }
            else if (uVar5 < uVar4) {
              if ((uVar5 < i[lVar13 + lVar3 + -1]) && (uVar5 < i[lVar12 + lVar3 + -2])) {
                if (uVar5 < i[lVar7 + lVar3]) {
                  if (uVar5 < i[lVar3 + -3]) goto LAB_003d181c;
                  bVar1 = i[lVar10 + lVar3 + 3];
                }
                else {
                  if (i[lVar10 * 2 + lVar3 + 2] <= uVar5) goto LAB_003d3d85;
                  bVar1 = i[lVar10 + lVar3 + 3];
                }
joined_r0x003d2314:
                if (uVar5 < bVar1) {
LAB_003d2725:
                  if (uVar5 < i[lVar3 + 3]) {
LAB_003d2733:
                    if (uVar5 < i[lVar8 + lVar3]) goto LAB_003d2747;
                  }
                }
              }
            }
            else if (((((int)uVar4 < (int)uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) &&
                     (i[lVar13 + lVar3 + -1] < uVar16)) && (i[lVar12 + lVar3 + -2] < uVar16)) {
              if (i[lVar12 + lVar3 + 2] < uVar16) {
                if (i[lVar8 + lVar3] < uVar16) {
                  if (i[lVar3 + 3] < uVar16) {
                    if (uVar16 <= i[lVar10 + lVar3 + 3]) {
LAB_003d336e:
                      bVar1 = i[lVar7 + lVar3];
                      goto joined_r0x003d3097;
                    }
                    if (i[lVar10 * 2 + lVar3 + 2] < uVar16) goto LAB_003d36cc;
LAB_003d334f:
                    uVar5 = (uint)i[lVar7 + lVar3];
                    goto LAB_003d36c3;
                  }
LAB_003d30b1:
                  if (i[lVar7 + lVar3] < uVar16) {
                    bVar1 = i[lVar3 + -3];
                    goto joined_r0x003d2ba3;
                  }
                }
                else {
                  bVar1 = i[lVar7 + lVar3];
joined_r0x003d3128:
                  if (bVar1 < uVar16) {
                    bVar1 = i[lVar3 + -3];
                    goto joined_r0x003d3136;
                  }
                }
              }
              else if (i[lVar7 + lVar3] < uVar16) {
                bVar1 = i[lVar3 + -3];
                goto joined_r0x003d2ccd;
              }
            }
          }
        }
        else if ((int)(uint)i[lVar2 + lVar3] < (int)uVar16) {
          bVar1 = i[lVar2 + lVar3 + 1];
          if (uVar5 < bVar1) {
            bVar1 = i[lVar13 + lVar3];
            if (uVar5 < bVar1) {
              if ((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3 + -1])) {
                if (uVar5 < i[lVar12 + lVar3 + 2]) {
                  if (uVar5 < i[lVar8 + lVar3]) {
                    if (uVar5 < i[lVar3 + 3]) {
                      if (uVar5 < i[lVar10 + lVar3 + 3]) {
                        if (i[lVar10 * 2 + lVar3 + 2] <= uVar5) {
                          bVar1 = i[lVar12 + lVar3 + -2];
                          goto joined_r0x003d15df;
                        }
                        goto LAB_003d36cc;
                      }
LAB_003d35a7:
                      if (uVar5 < i[lVar12 + lVar3 + -2]) {
LAB_003d35b6:
                        bVar1 = i[lVar7 + lVar3];
joined_r0x003d2b6d:
                        if (uVar5 < bVar1) {
LAB_003d3659:
                          uVar16 = (uint)i[lVar3 + -3];
                          goto LAB_003d365e;
                        }
                      }
                    }
                    else {
                      bVar1 = i[lVar12 + lVar3 + -2];
joined_r0x003d3aa9:
                      if (uVar5 < bVar1) {
LAB_003d2b29:
                        if (uVar5 < i[lVar7 + lVar3]) {
LAB_003d2b3d:
                          bVar1 = i[lVar3 + -3];
joined_r0x003d26e9:
                          if (uVar5 < bVar1) {
LAB_003d33ae:
                            uVar16 = (uint)i[lVar10 + lVar3 + -3];
                            goto LAB_003d365e;
                          }
                        }
                      }
                    }
                  }
                  else if (uVar5 < i[lVar12 + lVar3 + -2]) {
LAB_003d2688:
                    bVar1 = i[lVar7 + lVar3];
joined_r0x003d3bce:
                    if (uVar5 < bVar1) {
LAB_003d269c:
                      if (uVar5 < i[lVar3 + -3]) {
LAB_003d26aa:
                        bVar1 = i[lVar10 + lVar3 + -3];
                        goto joined_r0x003d22f1;
                      }
                    }
                  }
                }
                else if (uVar5 < i[lVar12 + lVar3 + -2]) {
                  bVar1 = i[lVar7 + lVar3];
joined_r0x003d306f:
                  if (uVar5 < bVar1) {
                    bVar1 = i[lVar3 + -3];
joined_r0x003d38e2:
                    if (uVar5 < bVar1) {
                      bVar1 = i[lVar10 + lVar3 + -3];
LAB_003d2286:
                      if (uVar5 < bVar1) goto LAB_003d2972;
                    }
                  }
                }
              }
            }
            else if (((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar13 + lVar3 + -1] < uVar16)) &&
                    (i[lVar12 + lVar3 + -2] < uVar16)) {
              if (i[lVar7 + lVar3] < uVar16) {
                if (i[lVar3 + -3] < uVar16) {
                  if (uVar16 <= i[lVar10 + lVar3 + -3]) goto LAB_003d2bbd;
                  if (uVar16 <= i[lVar10 * 2 + lVar3 + -2]) goto LAB_003d2bcb;
                  if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
LAB_003d2bdf:
                  bVar1 = i[lVar12 + lVar3 + 2];
joined_r0x003d31b1:
                  if (bVar1 < uVar16) goto LAB_003d2bee;
                }
                else {
                  if (uVar16 <= i[lVar10 + lVar3 + 3]) goto LAB_003d3d85;
LAB_003d2bbd:
                  if (i[lVar3 + 3] < uVar16) {
LAB_003d2bcb:
                    if (i[lVar8 + lVar3] < uVar16) goto LAB_003d2bdf;
                  }
                }
              }
              else if ((i[lVar10 * 2 + lVar3 + 2] < uVar16) && (i[lVar10 + lVar3 + 3] < uVar16))
              goto LAB_003d2bbd;
            }
          }
          else if (uVar16 < bVar1 || uVar16 == bVar1) {
            bVar1 = i[lVar13 + lVar3];
            if (uVar5 < bVar1) {
              if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3 + -1])) &&
                 (uVar5 < i[lVar12 + lVar3 + -2])) {
                if (uVar5 < i[lVar12 + lVar3 + 2]) {
                  if (uVar5 < i[lVar8 + lVar3]) {
                    if (uVar5 < i[lVar3 + 3]) {
                      if (i[lVar10 + lVar3 + 3] <= uVar5) {
                        bVar1 = i[lVar7 + lVar3];
                        goto joined_r0x003d2b6d;
                      }
                      if (uVar5 < i[lVar10 * 2 + lVar3 + 2]) goto LAB_003d36cc;
LAB_003d3051:
                      uVar16 = (uint)i[lVar7 + lVar3];
                      goto LAB_003d365e;
                    }
                    if (uVar5 < i[lVar7 + lVar3]) {
                      bVar1 = i[lVar3 + -3];
                      goto joined_r0x003d26e9;
                    }
                  }
                  else if ((uVar5 < i[lVar7 + lVar3]) && (uVar5 < i[lVar3 + -3])) {
                    bVar1 = i[lVar10 + lVar3 + -3];
                    goto joined_r0x003d22f1;
                  }
                }
                else if (((uVar5 < i[lVar7 + lVar3]) && (uVar5 < i[lVar3 + -3])) &&
                        (uVar5 < i[lVar10 + lVar3 + -3])) {
                  bVar1 = i[lVar10 * 2 + lVar3 + -2];
joined_r0x003d2ca6:
                  uVar4 = (uint)bVar1;
                  goto joined_r0x003d3cc2;
                }
              }
            }
            else if (((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar13 + lVar3 + -1] < uVar16)) &&
                    (i[lVar12 + lVar3 + -2] < uVar16)) {
              if (uVar16 <= i[lVar7 + lVar3]) {
                if (((uVar16 <= i[lVar10 * 2 + lVar3 + 2]) || (uVar16 <= i[lVar10 + lVar3 + 3])) ||
                   ((uVar16 <= i[lVar3 + 3] || (uVar16 <= i[lVar8 + lVar3])))) goto LAB_003d3d85;
                bVar1 = i[lVar12 + lVar3 + 2];
                goto joined_r0x003d31b1;
              }
              if (uVar16 <= i[lVar3 + -3]) {
                if (((i[lVar10 + lVar3 + 3] < uVar16) && (i[lVar3 + 3] < uVar16)) &&
                   (i[lVar8 + lVar3] < uVar16)) {
                  bVar1 = i[lVar12 + lVar3 + 2];
                  goto joined_r0x003d31b1;
                }
                goto LAB_003d3d85;
              }
              if (uVar16 <= i[lVar10 + lVar3 + -3]) {
                if ((i[lVar3 + 3] < uVar16) && (i[lVar8 + lVar3] < uVar16)) {
                  bVar1 = i[lVar12 + lVar3 + 2];
                  goto joined_r0x003d31b1;
                }
                goto LAB_003d3d85;
              }
              if (i[lVar10 * 2 + lVar3 + -2] < uVar16) {
                if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                bVar1 = i[lVar12 + lVar3 + 2];
              }
              else {
                if (uVar16 <= i[lVar8 + lVar3]) goto LAB_003d3d85;
                bVar1 = i[lVar12 + lVar3 + 2];
              }
              if (uVar16 <= bVar1) goto LAB_003d3d85;
LAB_003d2bee:
              uVar5 = (uint)i[lVar13 + lVar3 + 1];
LAB_003d36c3:
              if (uVar5 < uVar16) {
LAB_003d36cc:
                iVar18 = iVar17;
                iVar11 = iVar14;
              }
            }
          }
          else {
            bVar1 = i[lVar10 * 2 + lVar3 + 2];
            if (uVar5 < bVar1) {
              bVar1 = i[lVar13 + lVar3 + -1];
              if (uVar5 < bVar1) {
                if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                   (uVar5 < i[lVar12 + lVar3 + -2])) {
                  if (i[lVar12 + lVar3 + 2] <= uVar5) {
                    bVar1 = i[lVar7 + lVar3];
                    goto joined_r0x003d306f;
                  }
                  if (i[lVar8 + lVar3] <= uVar5) goto LAB_003d2688;
                  if (i[lVar3 + 3] <= uVar5) goto LAB_003d2b29;
                  if (i[lVar10 + lVar3 + 3] <= uVar5) goto LAB_003d35b6;
                  goto LAB_003d36cc;
                }
              }
              else if (((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar12 + lVar3 + -2] < uVar16))
                      && (i[lVar7 + lVar3] < uVar16)) {
                if (i[lVar3 + -3] < uVar16) {
                  if (i[lVar10 + lVar3 + -3] < uVar16) {
                    if (uVar16 <= i[lVar10 * 2 + lVar3 + -2]) goto LAB_003d3439;
                    if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                  }
                  else {
                    if (uVar16 <= i[lVar3 + 3]) goto LAB_003d3d85;
LAB_003d3439:
                    if (uVar16 <= i[lVar8 + lVar3]) goto LAB_003d3d85;
                  }
                  if (i[lVar12 + lVar3 + 2] < uVar16) {
                    bVar1 = i[lVar13 + lVar3 + 1];
joined_r0x003d393b:
                    if (bVar1 < uVar16) goto LAB_003d346b;
                  }
                }
                else if ((i[lVar10 + lVar3 + 3] < uVar16) && (i[lVar3 + 3] < uVar16))
                goto LAB_003d3439;
              }
            }
            else if (uVar16 < bVar1 || uVar16 == bVar1) {
              bVar1 = i[lVar13 + lVar3 + -1];
              if (uVar5 < bVar1) {
                if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                   ((uVar5 < i[lVar12 + lVar3 + -2] && (uVar5 < i[lVar7 + lVar3])))) {
                  if (uVar5 < i[lVar12 + lVar3 + 2]) {
                    if (uVar5 < i[lVar8 + lVar3]) {
                      if (i[lVar3 + 3] <= uVar5) {
                        bVar1 = i[lVar3 + -3];
                        goto joined_r0x003d26e9;
                      }
                      if (i[lVar10 + lVar3 + 3] <= uVar5) goto LAB_003d3659;
                      goto LAB_003d36cc;
                    }
                    if (uVar5 < i[lVar3 + -3]) {
                      bVar1 = i[lVar10 + lVar3 + -3];
                      goto joined_r0x003d22f1;
                    }
                  }
                  else if ((uVar5 < i[lVar3 + -3]) && (uVar5 < i[lVar10 + lVar3 + -3])) {
                    bVar1 = i[lVar10 * 2 + lVar3 + -2];
                    goto joined_r0x003d2ca6;
                  }
                }
              }
              else if (((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar12 + lVar3 + -2] < uVar16))
                      && (i[lVar7 + lVar3] < uVar16)) {
                if (i[lVar3 + -3] < uVar16) {
                  if (uVar16 <= i[lVar10 + lVar3 + -3]) {
                    if (((i[lVar3 + 3] < uVar16) && (i[lVar8 + lVar3] < uVar16)) &&
                       (i[lVar12 + lVar3 + 2] < uVar16)) {
                      bVar1 = i[lVar13 + lVar3 + 1];
                      goto joined_r0x003d34bf;
                    }
                    goto LAB_003d3d85;
                  }
                  if (i[lVar10 * 2 + lVar3 + -2] < uVar16) {
                    if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                    if (i[lVar12 + lVar3 + 2] < uVar16) {
                      bVar1 = i[lVar13 + lVar3 + 1];
                      goto joined_r0x003d393b;
                    }
                    goto LAB_003d3d85;
                  }
                  if ((uVar16 <= i[lVar8 + lVar3]) || (uVar16 <= i[lVar12 + lVar3 + 2]))
                  goto LAB_003d3d85;
                  bVar1 = i[lVar13 + lVar3 + 1];
                  goto joined_r0x003d393b;
                }
                if ((((uVar16 <= i[lVar10 + lVar3 + 3]) || (uVar16 <= i[lVar3 + 3])) ||
                    (uVar16 <= i[lVar8 + lVar3])) || (uVar16 <= i[lVar12 + lVar3 + 2]))
                goto LAB_003d3d85;
                bVar1 = i[lVar13 + lVar3 + 1];
joined_r0x003d34bf:
                if (uVar16 <= bVar1) goto LAB_003d3d85;
LAB_003d346b:
                uVar5 = (uint)i[lVar13 + lVar3];
                goto LAB_003d36c3;
              }
            }
            else {
              bVar1 = i[lVar10 + lVar3 + 3];
              if (uVar5 < bVar1) {
                bVar1 = i[lVar12 + lVar3 + -2];
                if (uVar5 < bVar1) {
                  if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                     ((uVar5 < i[lVar13 + lVar3 + -1] && (uVar5 < i[lVar7 + lVar3])))) {
                    if (i[lVar12 + lVar3 + 2] <= uVar5) {
                      bVar1 = i[lVar3 + -3];
                      goto joined_r0x003d38e2;
                    }
                    if (i[lVar8 + lVar3] <= uVar5) goto LAB_003d269c;
                    if (i[lVar3 + 3] <= uVar5) goto LAB_003d2b3d;
                    goto LAB_003d36cc;
                  }
                }
                else if (((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar7 + lVar3] < uVar16)) &&
                        (i[lVar3 + -3] < uVar16)) {
                  if (i[lVar10 + lVar3 + -3] < uVar16) {
                    if (i[lVar10 * 2 + lVar3 + -2] < uVar16) {
                      if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                      if (uVar16 <= i[lVar12 + lVar3 + 2]) goto LAB_003d3d85;
LAB_003d3969:
                      if (i[lVar13 + lVar3 + 1] < uVar16) {
                        bVar1 = i[lVar13 + lVar3];
joined_r0x003d3b79:
                        if (bVar1 < uVar16) {
                          uVar5 = (uint)i[lVar13 + lVar3 + -1];
                          goto LAB_003d36c3;
                        }
                      }
                    }
                    else if (i[lVar8 + lVar3] < uVar16) {
                      bVar1 = i[lVar12 + lVar3 + 2];
                      goto joined_r0x003d3775;
                    }
                  }
                  else if ((i[lVar3 + 3] < uVar16) && (i[lVar8 + lVar3] < uVar16)) {
                    bVar1 = i[lVar12 + lVar3 + 2];
joined_r0x003d3775:
                    if (bVar1 < uVar16) goto LAB_003d3969;
                  }
                }
              }
              else if (uVar16 < bVar1 || uVar16 == bVar1) {
                bVar1 = i[lVar12 + lVar3 + -2];
                if (uVar5 < bVar1) {
                  if ((((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                      (uVar5 < i[lVar13 + lVar3 + -1])) &&
                     ((uVar5 < i[lVar7 + lVar3] && (uVar5 < i[lVar3 + -3])))) {
                    if (uVar5 < i[lVar12 + lVar3 + 2]) {
                      if (i[lVar8 + lVar3] <= uVar5) goto LAB_003d26aa;
                      if (i[lVar3 + 3] <= uVar5) goto LAB_003d33ae;
                      goto LAB_003d36cc;
                    }
                    if (uVar5 < i[lVar10 + lVar3 + -3]) {
                      uVar4 = (uint)i[lVar10 * 2 + lVar3 + -2];
                      goto joined_r0x003d3cc2;
                    }
                  }
                }
                else if (((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar7 + lVar3] < uVar16)) &&
                        (i[lVar3 + -3] < uVar16)) {
                  if (i[lVar10 + lVar3 + -3] < uVar16) {
                    if (i[lVar10 * 2 + lVar3 + -2] < uVar16) {
                      if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                      if ((i[lVar12 + lVar3 + 2] < uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) {
                        bVar1 = i[lVar13 + lVar3];
                        goto joined_r0x003d3b79;
                      }
                    }
                    else if (((i[lVar8 + lVar3] < uVar16) && (i[lVar12 + lVar3 + 2] < uVar16)) &&
                            (i[lVar13 + lVar3 + 1] < uVar16)) {
                      bVar1 = i[lVar13 + lVar3];
                      goto joined_r0x003d3b79;
                    }
                  }
                  else if (((i[lVar3 + 3] < uVar16) && (i[lVar8 + lVar3] < uVar16)) &&
                          ((i[lVar12 + lVar3 + 2] < uVar16 && (i[lVar13 + lVar3 + 1] < uVar16)))) {
                    bVar1 = i[lVar13 + lVar3];
                    goto joined_r0x003d3b79;
                  }
                }
              }
              else {
                bVar1 = i[lVar3 + 3];
                if (uVar5 < bVar1) {
                  bVar1 = i[lVar10 + lVar3 + -3];
                  if (uVar5 < bVar1) {
                    if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                       ((uVar5 < i[lVar13 + lVar3 + -1] &&
                        ((uVar5 < i[lVar12 + lVar3 + -2] && (uVar5 < i[lVar7 + lVar3])))))) {
                      bVar1 = i[lVar3 + -3];
joined_r0x003d3312:
                      if (uVar5 < bVar1) {
                        if (i[lVar12 + lVar3 + 2] <= uVar5) goto LAB_003d2972;
                        if (i[lVar8 + lVar3] <= uVar5) goto LAB_003d310f;
                        goto LAB_003d36cc;
                      }
                    }
                  }
                  else if (uVar16 < bVar1 || uVar16 == bVar1) {
                    if (((uVar5 < i[lVar8 + lVar3]) && (uVar5 < i[lVar12 + lVar3 + 2])) &&
                       ((uVar5 < i[lVar13 + lVar3 + 1] &&
                        ((uVar5 < i[lVar13 + lVar3] && (uVar5 < i[lVar13 + lVar3 + -1]))))))
                    goto LAB_003d35a7;
                  }
                  else {
                    bVar1 = i[lVar7 + lVar3];
                    if (uVar5 < bVar1) {
                      if ((((uVar5 < i[lVar8 + lVar3]) && (uVar5 < i[lVar12 + lVar3 + 2])) &&
                          (uVar5 < i[lVar13 + lVar3 + 1])) &&
                         ((uVar5 < i[lVar13 + lVar3] && (uVar5 < i[lVar13 + lVar3 + -1])))) {
                        bVar1 = i[lVar12 + lVar3 + -2];
                        goto joined_r0x003d2b6d;
                      }
                    }
                    else if ((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar3 + -3] < uVar16)) {
                      if (i[lVar10 * 2 + lVar3 + -2] < uVar16) {
                        if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                        if (i[lVar12 + lVar3 + 2] < uVar16) {
                          bVar1 = i[lVar13 + lVar3 + 1];
                          goto joined_r0x003d3d3f;
                        }
                      }
                      else if ((i[lVar8 + lVar3] < uVar16) && (i[lVar12 + lVar3 + 2] < uVar16)) {
                        bVar1 = i[lVar13 + lVar3 + 1];
joined_r0x003d3d3f:
                        if ((bVar1 < uVar16) && (i[lVar13 + lVar3] < uVar16)) {
                          bVar1 = i[lVar13 + lVar3 + -1];
                          goto joined_r0x003d3d13;
                        }
                      }
                    }
                  }
                }
                else if (uVar16 < bVar1 || uVar16 == bVar1) {
                  bVar1 = i[lVar7 + lVar3];
                  if (uVar5 < bVar1) {
                    if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                       ((uVar5 < i[lVar13 + lVar3 + -1] &&
                        ((uVar5 < i[lVar12 + lVar3 + -2] && (uVar5 < i[lVar3 + -3])))))) {
                      bVar1 = i[lVar10 + lVar3 + -3];
                      goto joined_r0x003d3312;
                    }
                  }
                  else if (((bVar1 <= uVar16 && uVar16 != bVar1) && (i[lVar3 + -3] < uVar16)) &&
                          (i[lVar10 + lVar3 + -3] < uVar16)) {
                    if (i[lVar10 * 2 + lVar3 + -2] < uVar16) {
                      if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                      if ((i[lVar12 + lVar3 + 2] < uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) {
                        bVar1 = i[lVar13 + lVar3];
                        goto joined_r0x003d3d08;
                      }
                    }
                    else if (((i[lVar8 + lVar3] < uVar16) && (i[lVar12 + lVar3 + 2] < uVar16)) &&
                            (i[lVar13 + lVar3 + 1] < uVar16)) {
                      bVar1 = i[lVar13 + lVar3];
joined_r0x003d3d08:
                      if (bVar1 < uVar16) {
                        bVar1 = i[lVar13 + lVar3 + -1];
joined_r0x003d3d13:
                        if (bVar1 < uVar16) goto LAB_003d18d3;
                      }
                    }
                  }
                }
                else {
                  bVar1 = i[lVar8 + lVar3];
                  if (uVar5 < bVar1) {
                    bVar1 = i[lVar10 * 2 + lVar3 + -2];
                    if (uVar5 < bVar1) {
                      if (((((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                           (uVar5 < i[lVar13 + lVar3 + -1])) &&
                          ((uVar5 < i[lVar12 + lVar3 + -2] && (uVar5 < i[lVar7 + lVar3])))) &&
                         (uVar5 < i[lVar3 + -3])) {
                        bVar1 = i[lVar10 + lVar3 + -3];
LAB_003d38bd:
                        if (uVar5 < bVar1) {
                          if (i[lVar12 + lVar3 + 2] <= uVar5) goto LAB_003d2981;
                          goto LAB_003d36cc;
                        }
                      }
                    }
                    else if (uVar16 < bVar1 || uVar16 == bVar1) {
                      if (((uVar5 < i[lVar12 + lVar3 + 2]) && (uVar5 < i[lVar13 + lVar3 + 1])) &&
                         ((uVar5 < i[lVar13 + lVar3] && (uVar5 < i[lVar13 + lVar3 + -1])))) {
                        bVar1 = i[lVar12 + lVar3 + -2];
                        goto joined_r0x003d3aa9;
                      }
                    }
                    else {
                      bVar1 = i[lVar3 + -3];
                      if (uVar5 < bVar1) {
                        if (((uVar5 < i[lVar12 + lVar3 + 2]) && (uVar5 < i[lVar13 + lVar3 + 1])) &&
                           ((uVar5 < i[lVar13 + lVar3] &&
                            ((uVar5 < i[lVar13 + lVar3 + -1] && (uVar5 < i[lVar12 + lVar3 + -2])))))
                           ) {
                          bVar1 = i[lVar7 + lVar3];
                          goto joined_r0x003d26e9;
                        }
                      }
                      else if ((bVar1 <= uVar16 && uVar16 != bVar1) &&
                              (i[lVar10 + lVar3 + -3] < uVar16)) {
                        if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                        if (((i[lVar12 + lVar3 + 2] < uVar16) && (i[lVar13 + lVar3 + 1] < uVar16))
                           && (i[lVar13 + lVar3] < uVar16)) {
                          bVar1 = i[lVar13 + lVar3 + -1];
                          goto joined_r0x003d3b20;
                        }
                      }
                    }
                  }
                  else if (uVar16 < bVar1 || uVar16 == bVar1) {
                    bVar1 = i[lVar3 + -3];
                    if (uVar5 < bVar1) {
                      if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                         ((uVar5 < i[lVar13 + lVar3 + -1] &&
                          (((uVar5 < i[lVar12 + lVar3 + -2] && (uVar5 < i[lVar7 + lVar3])) &&
                           (uVar5 < i[lVar10 + lVar3 + -3])))))) {
                        bVar1 = i[lVar10 * 2 + lVar3 + -2];
                        goto LAB_003d38bd;
                      }
                    }
                    else if (((bVar1 <= uVar16 && uVar16 != bVar1) &&
                             (i[lVar10 + lVar3 + -3] < uVar16)) &&
                            (i[lVar10 * 2 + lVar3 + -2] < uVar16)) {
                      if (i[lVar2 + lVar3 + -1] < uVar16) goto LAB_003d36cc;
                      if (((i[lVar12 + lVar3 + 2] < uVar16) && (i[lVar13 + lVar3 + 1] < uVar16)) &&
                         (i[lVar13 + lVar3] < uVar16)) {
                        bVar1 = i[lVar13 + lVar3 + -1];
joined_r0x003d3b20:
                        if (bVar1 < uVar16) goto LAB_003d1a2b;
                      }
                    }
                  }
                  else {
                    bVar1 = i[lVar12 + lVar3 + 2];
                    if (uVar5 < bVar1) {
                      if (i[lVar2 + lVar3 + -1] < uVar16) {
                        uVar4 = (uint)i[lVar10 + lVar3 + -3];
                        if (uVar4 <= uVar5) goto joined_r0x003d279b;
                        if ((((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                            (uVar5 < i[lVar13 + lVar3 + -1])) &&
                           ((uVar5 < i[lVar12 + lVar3 + -2] && (uVar5 < i[lVar7 + lVar3])))) {
                          bVar1 = i[lVar3 + -3];
                          goto joined_r0x003d22f1;
                        }
                      }
                      else if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                              ((uVar5 < i[lVar13 + lVar3 + -1] && (uVar5 < i[lVar12 + lVar3 + -2])))
                              ) {
                        bVar1 = i[lVar7 + lVar3];
                        goto joined_r0x003d3bce;
                      }
                    }
                    else if (uVar16 < bVar1 || uVar16 == bVar1) {
                      bVar1 = i[lVar10 + lVar3 + -3];
                      if (uVar5 < bVar1) {
                        if (((uVar5 < i[lVar13 + lVar3 + 1]) && (uVar5 < i[lVar13 + lVar3])) &&
                           ((uVar5 < i[lVar13 + lVar3 + -1] &&
                            ((uVar5 < i[lVar12 + lVar3 + -2] && (uVar5 < i[lVar7 + lVar3])))))) {
                          bVar1 = i[lVar3 + -3];
                          goto LAB_003d2286;
                        }
                      }
                      else if (bVar1 <= uVar16 && uVar16 != bVar1) goto LAB_003d36ae;
                    }
                    else {
                      bVar1 = i[lVar13 + lVar3 + 1];
                      if (bVar1 <= uVar5) {
                        if (bVar1 <= uVar16 && uVar16 != bVar1) {
                          bVar1 = i[lVar13 + lVar3];
                          goto LAB_003d3d6b;
                        }
LAB_003d36ae:
                        uVar4 = (uint)i[lVar10 * 2 + lVar3 + -2];
                        goto joined_r0x003d2368;
                      }
                      uVar4 = (uint)i[lVar10 * 2 + lVar3 + -2];
                      if (uVar4 <= uVar5) goto joined_r0x003d2368;
                      if ((((uVar5 < i[lVar13 + lVar3]) && (uVar5 < i[lVar13 + lVar3 + -1])) &&
                          (uVar5 < i[lVar12 + lVar3 + -2])) &&
                         ((uVar5 < i[lVar7 + lVar3] && (uVar5 < i[lVar3 + -3])))) {
                        uVar4 = (uint)i[lVar10 + lVar3 + -3];
                        goto joined_r0x003d3cc2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else if (uVar5 < i[lVar13 + lVar3 + 1]) {
          if ((uVar5 < i[lVar13 + lVar3]) && (uVar5 < i[lVar13 + lVar3 + -1])) {
            if (uVar5 < i[lVar12 + lVar3 + 2]) {
              if (uVar5 < i[lVar8 + lVar3]) {
                if (uVar5 < i[lVar3 + 3]) {
                  if (uVar5 < i[lVar10 + lVar3 + 3]) {
                    if (uVar5 < i[lVar10 * 2 + lVar3 + 2]) {
                      if (uVar5 < i[lVar2 + lVar3 + 1]) goto LAB_003d36cc;
                      goto LAB_003d16d2;
                    }
                    bVar1 = i[lVar12 + lVar3 + -2];
joined_r0x003d15df:
                    if (uVar5 < bVar1) goto LAB_003d3051;
                  }
                  else if (uVar5 < i[lVar12 + lVar3 + -2]) {
                    bVar1 = i[lVar7 + lVar3];
                    goto joined_r0x003d2b6d;
                  }
                }
                else if ((uVar5 < i[lVar12 + lVar3 + -2]) && (uVar5 < i[lVar7 + lVar3])) {
                  bVar1 = i[lVar3 + -3];
                  goto joined_r0x003d26e9;
                }
              }
              else if (((uVar5 < i[lVar12 + lVar3 + -2]) && (uVar5 < i[lVar7 + lVar3])) &&
                      (uVar5 < i[lVar3 + -3])) {
                bVar1 = i[lVar10 + lVar3 + -3];
joined_r0x003d22f1:
                if (uVar5 < bVar1) {
LAB_003d310f:
                  uVar16 = (uint)i[lVar10 * 2 + lVar3 + -2];
                  goto LAB_003d365e;
                }
              }
            }
            else if ((((uVar5 < i[lVar12 + lVar3 + -2]) && (uVar5 < i[lVar7 + lVar3])) &&
                     (uVar5 < i[lVar3 + -3])) && (uVar5 < i[lVar10 + lVar3 + -3])) {
              uVar4 = (uint)i[lVar10 * 2 + lVar3 + -2];
joined_r0x003d3cc2:
              if (uVar5 < uVar4) goto LAB_003d2981;
            }
          }
        }
        else if ((((int)(uint)i[lVar13 + lVar3 + 1] < (int)uVar16) && (i[lVar13 + lVar3] < uVar16))
                && (i[lVar13 + lVar3 + -1] < uVar16)) {
          if (i[lVar12 + lVar3 + 2] < uVar16) {
            if (i[lVar8 + lVar3] < uVar16) {
              if (i[lVar3 + 3] < uVar16) {
                if (i[lVar10 + lVar3 + 3] < uVar16) {
                  if (uVar16 <= i[lVar10 * 2 + lVar3 + 2]) {
                    bVar1 = i[lVar12 + lVar3 + -2];
                    goto joined_r0x003d3349;
                  }
                  if (i[lVar2 + lVar3 + 1] < uVar16) goto LAB_003d36cc;
LAB_003d18d3:
                  uVar5 = (uint)i[lVar12 + lVar3 + -2];
                  goto LAB_003d36c3;
                }
                if (i[lVar12 + lVar3 + -2] < uVar16) {
                  bVar1 = i[lVar7 + lVar3];
                  goto joined_r0x003d3097;
                }
              }
              else if ((i[lVar12 + lVar3 + -2] < uVar16) && (i[lVar7 + lVar3] < uVar16)) {
                bVar1 = i[lVar3 + -3];
joined_r0x003d2ba3:
                if (bVar1 < uVar16) {
LAB_003d30d3:
                  uVar5 = (uint)i[lVar10 + lVar3 + -3];
                  goto LAB_003d36c3;
                }
              }
            }
            else if (((i[lVar12 + lVar3 + -2] < uVar16) && (i[lVar7 + lVar3] < uVar16)) &&
                    (i[lVar3 + -3] < uVar16)) {
              uVar4 = (uint)i[lVar10 + lVar3 + -3];
joined_r0x003d279b:
              if (uVar4 < uVar16) {
LAB_003d33ea:
                uVar5 = (uint)i[lVar10 * 2 + lVar3 + -2];
                goto LAB_003d36c3;
              }
            }
          }
          else if (((i[lVar12 + lVar3 + -2] < uVar16) && (i[lVar7 + lVar3] < uVar16)) &&
                  ((i[lVar3 + -3] < uVar16 && (i[lVar10 + lVar3 + -3] < uVar16)))) {
            uVar4 = (uint)i[lVar10 * 2 + lVar3 + -2];
joined_r0x003d2368:
            if (uVar4 < uVar16) {
LAB_003d36bd:
              uVar5 = (uint)i[lVar2 + lVar3 + -1];
              goto LAB_003d36c3;
            }
          }
        }
LAB_003d3d85:
      } while ((iVar11 != iVar18 + -1) &&
              (iVar14 = iVar11 + iVar18, iVar17 = iVar18, iVar11 != iVar18));
      piVar6[uVar15] = iVar11;
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uint)num_corners);
  }
  return piVar6;
}

Assistant:

int* aom_fast9_score(const byte* i, int stride, const xy* corners, int num_corners, int b)
{
  int* scores = (int*)malloc(sizeof(int)* num_corners);
  int n;

  int pixel[16];
  if(!scores) return NULL;
  make_offsets(pixel, stride);

  for(n=0; n < num_corners; n++)
    scores[n] = fast9_corner_score(i + corners[n].y*stride + corners[n].x, pixel, b);

  return scores;
}